

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

void __thiscall
testing::internal::SingleFailureChecker::~SingleFailureChecker(SingleFailureChecker *this)

{
  Type TVar1;
  TestPartResultArray *this_00;
  pointer pcVar2;
  int iVar3;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  this_01;
  TestPartResult *pTVar4;
  AssertionResult *pAVar5;
  stringstream *this_02;
  AssertHelperData *pAVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  int index;
  char *pcVar8;
  ostream *this_03;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  __ptr;
  string expected;
  undefined1 local_78 [8];
  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_70;
  undefined1 local_68 [8];
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_60;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_58;
  undefined1 local_50 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  this_00 = this->results_;
  TVar1 = this->type_;
  pcVar8 = "1 non-fatal failure";
  if (TVar1 == kFatalFailure) {
    pcVar8 = "1 fatal failure";
  }
  local_50._0_8_ = (stringstream *)(local_50 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_50,pcVar8,pcVar8 + (ulong)(TVar1 != kFatalFailure) * 4 + 0xf);
  this_01._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       operator_new(0x188);
  std::__cxx11::stringstream::stringstream((stringstream *)this_01._M_head_impl);
  *(undefined8 *)
   ((stringstream *)this_01._M_head_impl + 0x18 +
   *(long *)(*(long *)((stringstream *)this_01._M_head_impl + 0x10) + -0x18)) = 0x11;
  local_58._M_head_impl = this_01._M_head_impl;
  if ((int)((ulong)(*(long *)(this_00 + 8) - *(long *)this_00) >> 4) * -0x49249249 == 1) {
    pTVar4 = TestPartResultArray::GetTestPartResult(this_00,0);
    if (pTVar4->type_ == TVar1) {
      pcVar8 = strstr((pTVar4->message_)._M_dataplus._M_p,(this->substr_)._M_dataplus._M_p);
      if (pcVar8 == (char *)0x0) {
        local_68 = (undefined1  [8])((ulong)local_68 & 0xffffffffffffff00);
        local_60._M_head_impl =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        pAVar5 = AssertionResult::operator<<((AssertionResult *)local_68,(char (*) [11])0x1ec4fc);
        pAVar5 = AssertionResult::operator<<
                           (pAVar5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_50);
        pAVar5 = AssertionResult::operator<<(pAVar5,(char (*) [14])" containing \"");
        pAVar5 = AssertionResult::operator<<(pAVar5,&this->substr_);
        pAVar5 = AssertionResult::operator<<(pAVar5,(char (*) [3])0x1ece78);
        pAVar5 = AssertionResult::operator<<(pAVar5,(char (*) [11])"  Actual:\n");
        pAVar5 = AssertionResult::operator<<(pAVar5,pTVar4);
        AssertionResult::AssertionResult((AssertionResult *)local_78,pAVar5);
        if (local_60._M_head_impl !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_60,local_60._M_head_impl);
        }
      }
      else {
        local_78[0] = true;
        local_70._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )(_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
      }
    }
    else {
      local_68 = (undefined1  [8])((ulong)local_68 & 0xffffffffffffff00);
      local_60._M_head_impl =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      pAVar5 = AssertionResult::operator<<((AssertionResult *)local_68,(char (*) [11])0x1ec4fc);
      pAVar5 = AssertionResult::operator<<
                         (pAVar5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_50);
      pAVar5 = AssertionResult::operator<<(pAVar5,(char (*) [2])0x1ecb29);
      pAVar5 = AssertionResult::operator<<(pAVar5,(char (*) [11])"  Actual:\n");
      pAVar5 = AssertionResult::operator<<(pAVar5,pTVar4);
      AssertionResult::AssertionResult((AssertionResult *)local_78,pAVar5);
      if (local_60._M_head_impl !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_60,local_60._M_head_impl);
      }
    }
  }
  else {
    this_03 = (ostream *)((stringstream *)this_01._M_head_impl + 0x10);
    std::__ostream_insert<char,std::char_traits<char>>(this_03,"Expected: ",10);
    std::__ostream_insert<char,std::char_traits<char>>
              (this_03,(char *)local_50._0_8_,local_50._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(this_03,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(this_03,"  Actual: ",10);
    std::ostream::operator<<
              ((ostream *)this_03,
               (int)((ulong)(*(long *)(this_00 + 8) - *(long *)this_00) >> 4) * -0x49249249);
    std::__ostream_insert<char,std::char_traits<char>>(this_03," failures",9);
    if (0 < (int)((ulong)(*(long *)(this_00 + 8) - *(long *)this_00) >> 4) * -0x49249249) {
      index = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)((stringstream *)this_01._M_head_impl + 0x10),"\n",1);
        pTVar4 = TestPartResultArray::GetTestPartResult(this_00,index);
        this_01._M_head_impl = local_58._M_head_impl;
        testing::operator<<((ostream *)(local_58._M_head_impl + 0x10),pTVar4);
        index = index + 1;
        iVar3 = (int)((ulong)(*(long *)(this_00 + 8) - *(long *)this_00) >> 4);
      } while (SBORROW4(index,iVar3 * -0x49249249) != index + iVar3 * 0x49249249 < 0);
    }
    local_68 = (undefined1  [8])((ulong)local_68 & 0xffffffffffffff00);
    local_60._M_head_impl = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
    ;
    pAVar5 = AssertionResult::operator<<((AssertionResult *)local_68,(Message *)&local_58);
    AssertionResult::AssertionResult((AssertionResult *)local_78,pAVar5);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_60._M_head_impl !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_60,local_60._M_head_impl);
    }
    this_01._M_head_impl = local_58._M_head_impl;
    if (local_58._M_head_impl ==
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    goto LAB_00160f4f;
  }
  (**(code **)(*(long *)this_01._M_head_impl + 8))(this_01._M_head_impl);
LAB_00160f4f:
  if ((stringstream *)local_50._0_8_ != (stringstream *)(local_50 + 0x10)) {
    operator_delete((void *)local_50._0_8_,local_40._M_allocated_capacity + 1);
  }
  __ptr._M_head_impl = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70
  ;
  if (local_78[0] != true) {
    this_02 = (stringstream *)operator_new(0x188);
    std::__cxx11::stringstream::stringstream(this_02);
    __ptr._M_head_impl =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         local_70._M_t.
         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         ._M_head_impl;
    *(undefined8 *)(this_02 + *(long *)(*(long *)(this_02 + 0x10) + -0x18) + 0x18) = 0x11;
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_70._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = *(char **)local_70._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    local_50._0_8_ = this_02;
    pAVar6 = (AssertHelperData *)operator_new(0x38);
    pAVar6->type = kNonFatalFailure;
    pAVar6->file = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/third_party/gtest/googletest/src/gtest.cc"
    ;
    pAVar6->line = 0x2bd;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&pAVar6->message,pcVar8,(allocator<char> *)local_68);
    local_68 = (undefined1  [8])pAVar6;
    AssertHelper::operator=((AssertHelper *)local_68,(Message *)local_50);
    AssertHelper::~AssertHelper((AssertHelper *)local_68);
    (**(code **)(*(long *)this_02 + 8))(this_02);
  }
  if (__ptr._M_head_impl != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
     ) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,__ptr._M_head_impl);
  }
  pcVar2 = (this->substr_)._M_dataplus._M_p;
  paVar7 = &(this->substr_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar7) {
    operator_delete(pcVar2,paVar7->_M_allocated_capacity + 1);
  }
  return;
}

Assistant:

SingleFailureChecker::~SingleFailureChecker() {
  EXPECT_PRED_FORMAT3(HasOneFailure, *results_, type_, substr_);
}